

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void * upb_Arena_Realloc(upb_Arena *a,void *ptr,size_t oldsize,size_t size)

{
  _Bool _Var1;
  void *__dest;
  size_t local_50;
  void *ret;
  size_t size_local;
  size_t oldsize_local;
  void *ptr_local;
  upb_Arena *a_local;
  
  if (ptr != (void *)0x0) {
    if (size == oldsize) {
      return ptr;
    }
    if (size <= oldsize) {
      if ((char *)((long)ptr + (oldsize + 7 & 0xfffffffffffffff8)) !=
          a->ptr_dont_copy_me__upb_internal_use_only) {
        return ptr;
      }
      upb_Arena_ShrinkLast(a,ptr,oldsize,size);
      return ptr;
    }
    _Var1 = upb_Arena_TryExtend(a,ptr,oldsize,size);
    if (_Var1) {
      return ptr;
    }
  }
  __dest = upb_Arena_Malloc(a,size);
  if ((__dest != (void *)0x0) && (oldsize != 0)) {
    local_50 = size;
    if (oldsize < size) {
      local_50 = oldsize;
    }
    memcpy(__dest,ptr,local_50);
  }
  return __dest;
}

Assistant:

UPB_API_INLINE void* upb_Arena_Realloc(struct upb_Arena* a, void* ptr,
                                       size_t oldsize, size_t size) {
  UPB_TSAN_CHECK_WRITE(a->UPB_ONLYBITS(ptr));
  if (ptr) {
    if (size == oldsize) {
      return ptr;
    }
    if (size > oldsize) {
      if (upb_Arena_TryExtend(a, ptr, oldsize, size)) return ptr;
    } else {
      if ((char*)ptr + (UPB_ALIGN_MALLOC(oldsize) + UPB_ASAN_GUARD_SIZE) ==
          a->UPB_ONLYBITS(ptr)) {
        upb_Arena_ShrinkLast(a, ptr, oldsize, size);
      } else {
        UPB_POISON_MEMORY_REGION((char*)ptr + size, oldsize - size);
      }
      return ptr;
    }
  }
  void* ret = upb_Arena_Malloc(a, size);

  if (ret && oldsize > 0) {
    memcpy(ret, ptr, UPB_MIN(oldsize, size));
    UPB_POISON_MEMORY_REGION(ptr, oldsize);
  }

  return ret;
}